

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

shared_ptr<dap::Writer> __thiscall
dap::spy(dap *this,shared_ptr<dap::Writer> *w,shared_ptr<dap::Writer> *s,char *prefix)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<dap::Writer> sVar1;
  shared_ptr<(anonymous_namespace)::WriterSpy> local_38;
  char *local_28;
  char *prefix_local;
  shared_ptr<dap::Writer> *s_local;
  shared_ptr<dap::Writer> *w_local;
  
  local_28 = prefix;
  prefix_local = (char *)s;
  s_local = w;
  w_local = (shared_ptr<dap::Writer> *)this;
  std::
  make_shared<(anonymous_namespace)::WriterSpy,std::shared_ptr<dap::Writer>const&,std::shared_ptr<dap::Writer>const&,char_const*&>
            ((shared_ptr<dap::Writer> *)&local_38,w,(char **)s);
  std::shared_ptr<dap::Writer>::shared_ptr<(anonymous_namespace)::WriterSpy,void>
            ((shared_ptr<dap::Writer> *)this,&local_38);
  std::shared_ptr<(anonymous_namespace)::WriterSpy>::~shared_ptr(&local_38);
  sVar1.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<dap::Writer>)sVar1.super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Writer> spy(const std::shared_ptr<Writer>& w,
                            const std::shared_ptr<Writer>& s,
                            const char* prefix /* = "\n->" */) {
  return std::make_shared<WriterSpy>(w, s, prefix);
}